

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CommandLineInterface::RegisterGenerator
          (CommandLineInterface *this,string *flag_name,CodeGenerator *generator,string *help_text)

{
  mapped_type *this_00;
  undefined1 local_90 [8];
  GeneratorInfo info;
  string *help_text_local;
  CodeGenerator *generator_local;
  string *flag_name_local;
  CommandLineInterface *this_local;
  
  info.help_text.field_2._8_8_ = help_text;
  GeneratorInfo::GeneratorInfo((GeneratorInfo *)local_90);
  std::__cxx11::string::operator=((string *)local_90,(string *)flag_name);
  info.option_flag_name.field_2._8_8_ = generator;
  std::__cxx11::string::operator=((string *)&info.generator,(string *)info.help_text.field_2._8_8_);
  this_00 = absl::lts_20250127::container_internal::
            btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>>,256,false>>>
            ::operator[]<std::__cxx11::string>
                      ((btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>>,256,false>>>
                        *)&this->generators_by_flag_name_,flag_name);
  GeneratorInfo::operator=(this_00,(GeneratorInfo *)local_90);
  GeneratorInfo::~GeneratorInfo((GeneratorInfo *)local_90);
  return;
}

Assistant:

void CommandLineInterface::RegisterGenerator(const std::string& flag_name,
                                             CodeGenerator* generator,
                                             const std::string& help_text) {
  GeneratorInfo info;
  info.flag_name = flag_name;
  info.generator = generator;
  info.help_text = help_text;
  generators_by_flag_name_[flag_name] = info;
}